

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall MockHttpClient::MockHttpClient(MockHttpClient *this,Config *config)

{
  Config CVar1;
  Config *this_00;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 in_stack_ffffffffffffff28 [160];
  undefined1 auVar5 [40];
  Config *config_local;
  MockHttpClient *this_local;
  
  this_00 = (Config *)&stack0xffffffffffffff38;
  Vault::Config::Config(this_00,config);
  CVar1.connectTimeout_.value_ = (long)this_00;
  CVar1._0_8_ = this;
  auVar2 = in_stack_ffffffffffffff28._24_32_;
  auVar3 = in_stack_ffffffffffffff28._56_32_;
  auVar4 = in_stack_ffffffffffffff28._88_32_;
  auVar5 = in_stack_ffffffffffffff28._120_40_;
  CVar1.requestTimeout_.value_ = in_stack_ffffffffffffff28._0_8_;
  CVar1.lowSpeedTimeout_.value_ = in_stack_ffffffffffffff28._8_8_;
  CVar1.lowSpeedLimit_.value_ = in_stack_ffffffffffffff28._16_8_;
  CVar1.host_.value_._M_dataplus = (_Alloc_hider)auVar2[0];
  CVar1.host_.value_._1_7_ = auVar2._1_7_;
  CVar1.host_.value_._M_string_length = auVar2._8_8_;
  CVar1.host_.value_.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
        )auVar2._16_16_;
  CVar1.port_.value_._M_dataplus = (_Alloc_hider)auVar3[0];
  CVar1.port_.value_._1_7_ = auVar3._1_7_;
  CVar1.port_.value_._M_string_length = auVar3._8_8_;
  CVar1.port_.value_.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
        )auVar3._16_16_;
  CVar1.ns_.value_._M_dataplus = (_Alloc_hider)auVar4[0];
  CVar1.ns_.value_._1_7_ = auVar4._1_7_;
  CVar1.ns_.value_._M_string_length = auVar4._8_8_;
  CVar1.ns_.value_.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
        )auVar4._16_16_;
  auVar2 = auVar5._0_32_;
  CVar1.caBundle_._M_pathname._M_dataplus = (_Alloc_hider)auVar2[0];
  CVar1.caBundle_._M_pathname._1_7_ = auVar2._1_7_;
  CVar1.caBundle_._M_pathname._M_string_length = auVar2._8_8_;
  CVar1.caBundle_._M_pathname.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
        )auVar2._16_16_;
  CVar1.caBundle_._M_cmpts = (_List)auVar5[0x20];
  CVar1.caBundle_._33_7_ = auVar5._33_7_;
  Vault::HttpClient::HttpClient(&this->super_HttpClient,CVar1);
  Vault::Config::~Config((Config *)&stack0xffffffffffffff38);
  *(undefined ***)this = &PTR__MockHttpClient_0025df40;
  Catch::clara::std::optional<Vault::HttpResponse>::optional(&this->response_);
  return;
}

Assistant:

explicit MockHttpClient(Vault::Config &config) : HttpClient(config) {}